

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqdec.c
# Opt level: O3

void jpc_mqdec_init(jpc_mqdec_t *mqdec)

{
  byte bVar1;
  int iVar2;
  jas_stream_t *pjVar3;
  byte *pbVar4;
  uchar uVar5;
  uint uVar6;
  uint_fast32_t uVar7;
  long lVar8;
  
  mqdec->eof = 0;
  mqdec->creg = 0;
  pjVar3 = mqdec->in;
  if ((pjVar3->flags_ & 7U) == 0) {
    if ((-1 < pjVar3->rwlimit_) && (pjVar3->rwlimit_ <= pjVar3->rwcnt_)) {
      pjVar3->flags_ = pjVar3->flags_ | 4;
      goto LAB_001231fc;
    }
    iVar2 = pjVar3->cnt_;
    pjVar3->cnt_ = iVar2 + -1;
    if (0 < iVar2) {
      pjVar3->rwcnt_ = pjVar3->rwcnt_ + 1;
      pbVar4 = pjVar3->ptr_;
      pjVar3->ptr_ = pbVar4 + 1;
      bVar1 = *pbVar4;
      uVar6 = (uint)bVar1;
      mqdec->inbuffer = bVar1;
      mqdec->creg = mqdec->creg + (ulong)bVar1 * 0x10000;
LAB_00123274:
      uVar5 = (uchar)uVar6;
      pjVar3 = mqdec->in;
      if ((pjVar3->flags_ & 7U) == 0) {
        if ((-1 < pjVar3->rwlimit_) && (pjVar3->rwlimit_ <= pjVar3->rwcnt_)) {
          pjVar3->flags_ = pjVar3->flags_ | 4;
          goto LAB_00123280;
        }
        iVar2 = pjVar3->cnt_;
        pjVar3->cnt_ = iVar2 + -1;
        if (iVar2 < 1) {
          uVar6 = jas_stream_fillbuf(pjVar3,1);
          uVar5 = mqdec->inbuffer;
          if (uVar6 == 0xffffffff) goto LAB_00123280;
        }
        else {
          pjVar3->rwcnt_ = pjVar3->rwcnt_ + 1;
          pbVar4 = pjVar3->ptr_;
          pjVar3->ptr_ = pbVar4 + 1;
          uVar6 = (uint)*pbVar4;
        }
        mqdec->inbuffer = (uchar)uVar6;
        if (uVar5 == 0xff) {
          if ((int)uVar6 < 0x90) {
            lVar8 = (long)(int)(uVar6 << 9);
            uVar7 = 0;
            goto LAB_00123218;
          }
          goto LAB_0012320e;
        }
      }
      else {
LAB_00123280:
        mqdec->eof = 1;
        mqdec->inbuffer = 0xff;
        uVar6 = 0xff;
        if (uVar5 == 0xff) goto LAB_0012320e;
      }
      lVar8 = (long)(int)(uVar6 << 8);
      uVar7 = 1;
      goto LAB_00123218;
    }
    uVar6 = jas_stream_fillbuf(pjVar3,1);
    if (uVar6 == 0xffffffff) goto LAB_001231fc;
    mqdec->creg = mqdec->creg + (ulong)((uVar6 & 0xff) << 0x10);
    mqdec->inbuffer = (uchar)uVar6;
    if (mqdec->eof == 0) goto LAB_00123274;
  }
  else {
LAB_001231fc:
    mqdec->eof = 1;
    mqdec->inbuffer = 0xff;
    mqdec->creg = mqdec->creg + 0xff0000;
  }
LAB_0012320e:
  uVar7 = 1;
  lVar8 = 0xff00;
LAB_00123218:
  mqdec->creg = (lVar8 + mqdec->creg) * 0x80;
  mqdec->ctreg = uVar7;
  mqdec->areg = 0x8000;
  return;
}

Assistant:

void jpc_mqdec_init(jpc_mqdec_t *mqdec)
{
	int c;

	mqdec->eof = 0;
	mqdec->creg = 0;
	/* Get the next byte from the input stream. */
	if ((c = jas_stream_getc(mqdec->in)) == EOF) {
		/* We have encountered an I/O error or EOF. */
		c = 0xff;
		mqdec->eof = 1;
	}
	mqdec->inbuffer = c;
	mqdec->creg += mqdec->inbuffer << 16;
	jpc_mqdec_bytein(mqdec);
	mqdec->creg <<= 7;
	mqdec->ctreg -= 7;
	mqdec->areg = 0x8000;
}